

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cVertexAttribBindingTests.cpp
# Opt level: O1

long __thiscall gl4cts::anon_unknown_0::BasicInputLBase::Setup(BasicInputLBase *this)

{
  undefined8 *puVar1;
  long lVar2;
  
  this->m_po = 0;
  glu::CallLogWrapper::glGenBuffers
            (&(this->super_VertexAttribBindingBase).super_SubcaseBase.super_GLWrapper.
              super_CallLogWrapper,1,&this->m_xfbo);
  lVar2 = 0;
  do {
    puVar1 = (undefined8 *)((long)this->expected_data[0].m_data + lVar2 + 0x10);
    *puVar1 = 0;
    puVar1[1] = 0;
    puVar1 = (undefined8 *)((long)this->expected_data[0].m_data + lVar2);
    *puVar1 = 0;
    puVar1[1] = 0;
    lVar2 = lVar2 + 0x20;
  } while (lVar2 != 0x400);
  this->instance_count = 1;
  this->base_instance = 0;
  return 0;
}

Assistant:

virtual long Setup()
	{
		m_po = 0;
		glGenBuffers(1, &m_xfbo);
		for (int i = 0; i < 32; ++i)
		{
			expected_data[i] = DVec4(0.0);
		}
		instance_count = 1;
		base_instance  = 0;
		return NO_ERROR;
	}